

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

void __thiscall json::JSON::~JSON(JSON *this)

{
  iterator *piVar1;
  Class CVar2;
  _Map_pointer ppJVar3;
  deque<json::JSON,_std::allocator<json::JSON>_> *this_00;
  ulong uVar4;
  
  CVar2 = this->Type;
  if (CVar2 == Object) {
    this_00 = (this->Internal).List;
    if (this_00 != (deque<json::JSON,_std::allocator<json::JSON>_> *)0x0) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json::JSON>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json::JSON>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json::JSON>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json::JSON>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json::JSON>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json::JSON>_>_>
                   *)this_00);
    }
    uVar4 = 0x30;
  }
  else if (CVar2 == String) {
    this_00 = (this->Internal).List;
    if (this_00 != (deque<json::JSON,_std::allocator<json::JSON>_> *)0x0) {
      ppJVar3 = (this_00->super__Deque_base<json::JSON,_std::allocator<json::JSON>_>)._M_impl.
                super__Deque_impl_data._M_map;
      piVar1 = &(this_00->super__Deque_base<json::JSON,_std::allocator<json::JSON>_>)._M_impl.
                super__Deque_impl_data._M_start;
      if ((iterator *)ppJVar3 != piVar1) {
        operator_delete(ppJVar3,(ulong)((long)&piVar1->_M_cur->Internal + 1));
      }
    }
    uVar4 = 0x20;
  }
  else {
    if (CVar2 != Array) {
      return;
    }
    this_00 = (this->Internal).List;
    if (this_00 != (deque<json::JSON,_std::allocator<json::JSON>_> *)0x0) {
      std::deque<json::JSON,_std::allocator<json::JSON>_>::~deque(this_00);
    }
    uVar4 = 0x50;
  }
  operator_delete(this_00,uVar4);
  return;
}

Assistant:

~JSON() {
            switch( Type ) {
            case Class::Array:
                delete Internal.List;
                break;
            case Class::Object:
                delete Internal.Map;
                break;
            case Class::String:
                delete Internal.String;
                break;
            default:;
            }
        }